

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O2

Local __thiscall Wasm::WasmSignature::GetParam(WasmSignature *this,ArgSlot index)

{
  WasmCompilationException *this_00;
  
  if (index < this->m_paramsCount) {
    return (this->m_params).ptr[index];
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_00,L"Parameter %u out of range (max %u)",(ulong)index,(ulong)this->m_paramsCount);
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

Local WasmSignature::GetParam(Js::ArgSlot index) const
{
    if (index >= GetParamCount())
    {
        throw WasmCompilationException(_u("Parameter %u out of range (max %u)"), index, GetParamCount());
    }
    return m_params[index];
}